

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_leaflist(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  ly_stmt stmt_00;
  lyd_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  lysp_node *plVar4;
  lysp_node *plVar5;
  char *format;
  uint32_t substmt_index;
  lysp_node *plVar6;
  ly_ctx *plVar7;
  lysp_ext_instance **in_R8;
  char *pcVar8;
  lysp_ext_instance **in_R9;
  char *pcVar9;
  lysp_stmt *stmt_01;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    plVar4 = (lysp_node *)calloc(1,0xd0);
    if (plVar4 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_leaflist");
    }
    else {
      plVar6 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar5 = plVar6;
          plVar6 = plVar5->next;
        } while (plVar6 != (lysp_node *)0x0);
        siblings = &plVar5->next;
      }
      *siblings = plVar4;
      plVar4->nodetype = 8;
      plVar4->parent = parent;
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar7,stmt->arg,0,&plVar4->name);
      if (LVar3 == LY_SUCCESS) {
        stmt_01 = stmt->child;
        if (stmt_01 != (lysp_stmt *)0x0) {
          exts = &plVar4->exts;
          iVar2 = (int)plVar4;
          flags = &plVar4->flags;
          do {
            stmt_00 = stmt_01->kw;
            if ((int)stmt_00 < 0x1d0000) {
              if ((int)stmt_00 < 0xf0000) {
                if (stmt_00 == LY_STMT_CONFIG) {
                  LVar3 = lysp_stmt_config(ctx,stmt_01,flags,exts);
                }
                else {
                  if (stmt_00 != LY_STMT_DEFAULT) {
                    substmt_index = iVar2 + 0x20;
                    if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_0016a306;
                    goto LAB_0016a415;
                  }
                  plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  plVar6 = plVar4 + 3;
                  if (*(byte *)&plVar1[2].schema < 2) {
                    plVar7 = (ly_ctx *)**(undefined8 **)plVar1;
                    format = 
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ;
                    pcVar8 = "yang:orig-default";
                    goto LAB_0016a3f5;
                  }
LAB_0016a33b:
                  LVar3 = lysp_stmt_qnames(ctx,stmt_01,(lysp_qname **)plVar6,(yang_arg)exts,in_R8);
                }
              }
              else if ((int)stmt_00 < 0x190000) {
                if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) {
                  plVar6 = (lysp_node *)&plVar4->iffeatures;
                  if (stmt_00 == LY_STMT_IF_FEATURE) goto LAB_0016a33b;
LAB_0016a415:
                  if (ctx == (lysp_ctx *)0x0) {
                    plVar7 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar7 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar8 = lyplg_ext_stmt2str(stmt_00);
                  format = "Invalid keyword \"%s\" as a child of \"%s\".";
                  pcVar9 = "llist";
                  goto LAB_0016a403;
                }
                in_R8 = exts;
                LVar3 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_LEAF_LIST,0,exts);
              }
              else if (stmt_00 == LY_STMT_MAX_ELEMENTS) {
                in_R8 = exts;
                LVar3 = lysp_stmt_maxelements
                                  (ctx,stmt_01,(uint32_t *)&plVar4[3].field_0xc,flags,exts);
              }
              else {
                if (stmt_00 != LY_STMT_MIN_ELEMENTS) goto LAB_0016a415;
                in_R8 = exts;
                LVar3 = lysp_stmt_minelements
                                  (ctx,stmt_01,(uint32_t *)&plVar4[3].nodetype,flags,exts);
              }
            }
            else if ((int)stmt_00 < 0x2c0000) {
              if (stmt_00 == LY_STMT_MUST) {
                LVar3 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(plVar4 + 1));
              }
              else {
                if (stmt_00 != LY_STMT_ORDERED_BY) {
                  substmt_index = iVar2 + 0x28;
                  if (stmt_00 != LY_STMT_REFERENCE) goto LAB_0016a415;
                  goto LAB_0016a306;
                }
                LVar3 = lysp_stmt_orderedby(ctx,stmt_01,flags,exts);
              }
            }
            else if ((int)stmt_00 < 0x310000) {
              if (stmt_00 == LY_STMT_STATUS) {
                LVar3 = lysp_stmt_status(ctx,stmt_01,flags,exts);
              }
              else {
                if (stmt_00 != LY_STMT_TYPE) goto LAB_0016a415;
                LVar3 = lysp_stmt_type(ctx,stmt_01,(lysp_type *)&plVar4[1].next);
              }
            }
            else {
              substmt_index = iVar2 + 0xb8;
              if (stmt_00 == LY_STMT_UNITS) {
LAB_0016a306:
                in_R8 = exts;
                LVar3 = lysp_stmt_text_field
                                  (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
              }
              else {
                if (stmt_00 != LY_STMT_WHEN) goto LAB_0016a415;
                LVar3 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&plVar4[1].nodetype);
              }
            }
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            stmt_01 = stmt_01->next;
          } while (stmt_01 != (lysp_stmt *)0x0);
        }
        LVar3 = LY_SUCCESS;
        if (plVar4[1].next == (lysp_node *)0x0) {
          if (ctx == (lysp_ctx *)0x0) {
            plVar7 = (ly_ctx *)0x0;
          }
          else {
            plVar7 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
          pcVar8 = "decimal64 type";
LAB_0016a3f5:
          pcVar8 = pcVar8 + 10;
          pcVar9 = "leaf-list";
LAB_0016a403:
          ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar8,pcVar9);
          LVar3 = LY_EVALID;
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_leaflist(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_leaflist *llist;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new leaf-list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, llist, next, LY_EMEM);
    llist->nodetype = LYS_LEAFLIST;
    llist->parent = parent;

    /* get name */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &llist->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_DEFAULT:
            PARSER_CHECK_STMTVER2_RET(ctx, "default", "leaf-list");
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &llist->dflts, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->dsc, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &llist->iffeatures, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &llist->max, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &llist->min, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &llist->musts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(lysp_stmt_orderedby(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->ref, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(lysp_stmt_type(ctx, child, &llist->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->units, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &llist->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_LEAF_LIST, 0, &llist->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "llist");
            return LY_EVALID;
        }
    }

    /* mandatory substatements */
    if (!llist->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf-list");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}